

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_sec(secp256k1_context *ctx,uchar *seckey,secp256k1_keypair *keypair)

{
  secp256k1_callback *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0xd7,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (undefined8 *)0x0) {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x20);
    if (in_RDX == (secp256k1_callback *)0x0) {
      secp256k1_callback_call((secp256k1_callback *)0x0,in_stack_ffffffffffffffd8);
      local_4 = 0;
    }
    else {
      *in_RSI = in_RDX->fn;
      in_RSI[1] = in_RDX->data;
      in_RSI[2] = in_RDX[1].fn;
      in_RSI[3] = in_RDX[1].data;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_sec(const secp256k1_context* ctx, unsigned char *seckey, const secp256k1_keypair *keypair) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    memset(seckey, 0, 32);
    ARG_CHECK(keypair != NULL);

    memcpy(seckey, &keypair->data[0], 32);
    return 1;
}